

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle-allocator.hh
# Opt level: O0

bool __thiscall
tinyusdz::HandleAllocator<unsigned_long>::Allocate
          (HandleAllocator<unsigned_long> *this,unsigned_long *dst)

{
  value_type vVar1;
  ulong uVar2;
  bool bVar3;
  reference pvVar4;
  unsigned_long uVar5;
  unsigned_long handle;
  unsigned_long *dst_local;
  HandleAllocator<unsigned_long> *this_local;
  
  if (dst == (unsigned_long *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->freeList_);
    if (bVar3) {
      uVar2 = this->counter_;
      if ((uVar2 != 0) && (uVar5 = ::std::numeric_limits<unsigned_long>::max(), uVar2 < uVar5)) {
        this->counter_ = this->counter_ + 1;
        *dst = uVar2;
        return true;
      }
      this_local._7_1_ = false;
    }
    else {
      pvVar4 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->freeList_);
      vVar1 = *pvVar4;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->freeList_);
      this->dirty_ = true;
      *dst = vVar1;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Allocate(T *dst) {

    if (!dst) {
      return false;
    }

    T handle = 0;

    if (!freeList_.empty()) {
      // Reuse last element.
      handle = freeList_.back();
      freeList_.pop_back();
      // Delay sort until required
      dirty_ = true;
      (*dst) = handle;
      return true;
    }

    handle = counter_;
    if ((handle >= static_cast<T>(1)) && (handle < (std::numeric_limits<T>::max)())) {
      counter_++;
      //std::cout << "conter = " << counter_ << "\n";
      (*dst) = handle;
      return true;
    }

    return false;
  }